

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsDebugVariableWithIntScalarType
               (ValidationState_t *_,Instruction *inst,uint32_t word_index)

{
  spv_ext_inst_type_t sVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  spv_ext_inst_type_t *psVar5;
  uint32_t local_5c;
  OpenCLDebugInfo100DebugBaseTypeAttributeEncoding ocl_encoding;
  uint32_t encoding;
  bool vulkanDebugInfo;
  spv_ext_inst_type_t ext_inst_type;
  Instruction *dbg_type;
  Instruction *dbg_int_scalar_var;
  uint32_t word_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  uVar3 = Instruction::word(inst,(ulong)word_index);
  pIVar4 = ValidationState_t::FindDef(_,uVar3);
  uVar3 = Instruction::word(pIVar4,4);
  if ((uVar3 == 0x1a) || (uVar3 = Instruction::word(pIVar4,4), uVar3 == 0x12)) {
    uVar3 = Instruction::word(pIVar4,6);
    pIVar4 = ValidationState_t::FindDef(_,uVar3);
    uVar3 = Instruction::word(pIVar4,4);
    if (uVar3 == 2) {
      psVar5 = Instruction::ext_inst_type(inst);
      sVar1 = *psVar5;
      local_5c = Instruction::word(pIVar4,7);
      if ((sVar1 != SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) ||
         (bVar2 = IsUint32Constant(_,local_5c), bVar2)) {
        if (sVar1 == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          local_5c = GetUint32Constant(_,local_5c);
        }
        if ((local_5c == 4) || (local_5c == 6)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsDebugVariableWithIntScalarType(ValidationState_t& _,
                                      const Instruction* inst,
                                      uint32_t word_index) {
  auto* dbg_int_scalar_var = _.FindDef(inst->word(word_index));
  if (CommonDebugInfoInstructions(dbg_int_scalar_var->word(4)) ==
          CommonDebugInfoDebugLocalVariable ||
      CommonDebugInfoInstructions(dbg_int_scalar_var->word(4)) ==
          CommonDebugInfoDebugGlobalVariable) {
    auto* dbg_type = _.FindDef(dbg_int_scalar_var->word(6));
    if (CommonDebugInfoInstructions(dbg_type->word(4)) ==
        CommonDebugInfoDebugTypeBasic) {
      const spv_ext_inst_type_t ext_inst_type =
          spv_ext_inst_type_t(inst->ext_inst_type());
      const bool vulkanDebugInfo =
          ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100;
      uint32_t encoding = dbg_type->word(7);
      if (!vulkanDebugInfo || IsUint32Constant(_, encoding)) {
        auto ocl_encoding = OpenCLDebugInfo100DebugBaseTypeAttributeEncoding(
            vulkanDebugInfo ? GetUint32Constant(_, encoding) : encoding);
        if (ocl_encoding == OpenCLDebugInfo100Signed ||
            ocl_encoding == OpenCLDebugInfo100Unsigned) {
          return true;
        }
      }
    }
  }
  return false;
}